

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.cpp
# Opt level: O0

void __thiscall TPZFBMatrix<double>::Transpose(TPZFBMatrix<double> *this,TPZMatrix<double> *T)

{
  long *plVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long *in_RSI;
  long *in_RDI;
  int64_t c;
  int64_t r;
  int64_t begin;
  int64_t end;
  long local_70;
  long local_60;
  undefined8 local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long *local_10;
  
  local_10 = in_RSI;
  uVar2 = (**(code **)(*in_RDI + 0x60))();
  uVar3 = (**(code **)(*in_RDI + 0x60))();
  (**(code **)(*in_RSI + 0x68))(in_RSI,uVar2,uVar3);
  local_28 = 0;
  while( true ) {
    lVar5 = local_28;
    lVar4 = (**(code **)(*in_RDI + 0x60))();
    if (lVar4 <= lVar5) break;
    if (local_28 - in_RDI[8] < 1) {
      local_60 = 0;
    }
    else {
      local_60 = local_28 - in_RDI[8];
    }
    local_20 = local_60;
    lVar5 = local_28 + in_RDI[9];
    lVar4 = (**(code **)(*in_RDI + 0x60))();
    if (lVar5 + 1 < lVar4) {
      local_70 = local_28 + in_RDI[9] + 1;
    }
    else {
      local_70 = (**(code **)(*in_RDI + 0x60))();
    }
    local_18 = local_70;
    for (local_30 = local_20; plVar1 = local_10, lVar4 = local_28, lVar5 = local_30,
        local_30 < local_18; local_30 = local_30 + 1) {
      local_38 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_28,local_30);
      (**(code **)(*plVar1 + 0x118))(plVar1,lVar5,lVar4,&local_38);
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void
TPZFBMatrix<TVar>::Transpose (TPZMatrix<TVar> *const T) const
{
	T->Resize( Dim(), Dim() );
	
	int64_t end, begin;
	//REAL *p = fElem;
	for ( int64_t r = 0; r < Dim(); r++ )
    {
		begin = MAX( r - fBandLower, 0 );
		end   = MIN( r + fBandUpper + 1, Dim() );
		for ( int64_t c = begin; c < end; c++ )
		{
			T->PutVal( c, r, GetVal( r, c ) );
			//			cout<<"(r,c)= "<<r<<"  "<<c<<"\n";
		}
    }
}